

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  byte *pbVar1;
  byte bVar2;
  Ch *pCVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  byte *pbVar7;
  _func_int **pp_Var8;
  long lVar9;
  BaseState<true> *pBVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  byte *pbVar11;
  Ch *pCVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  byte *pbVar19;
  byte bVar20;
  bool bVar21;
  double dVar22;
  undefined4 uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  bVar2 = *is->src_;
  if (bVar2 < 0x6e) {
    if (bVar2 == 0x22) {
      ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                (this,is,handler,false);
      return;
    }
    if (bVar2 == 0x66) {
      pCVar3 = is->src_;
      pCVar12 = pCVar3 + 1;
      is->src_ = pCVar12;
      if (pCVar3[1] == 'a') {
        pCVar12 = pCVar3 + 2;
        is->src_ = pCVar12;
        if (pCVar3[2] == 'l') {
          pCVar12 = pCVar3 + 3;
          is->src_ = pCVar12;
          if (pCVar3[3] == 's') {
            pCVar12 = pCVar3 + 4;
            is->src_ = pCVar12;
            if (pCVar3[4] == 'e') {
              is->src_ = pCVar3 + 5;
              pBVar10 = (handler->ctx).current_state;
              iVar6 = (*pBVar10->_vptr_BaseState[1])(pBVar10,handler,0);
              if ((BaseState<true> *)CONCAT44(extraout_var_08,iVar6) != (BaseState<true> *)0x0) {
                (handler->ctx).previous_state = (handler->ctx).current_state;
                (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var_08,iVar6);
                return;
              }
              pCVar12 = is->src_;
              pCVar3 = is->head_;
              *(undefined4 *)(this + 0x30) = 0x10;
              *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar3;
              return;
            }
          }
        }
      }
      pCVar3 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar3;
      return;
    }
    if (bVar2 != 0x5b) {
      ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                (this,is,handler);
      return;
    }
    is->src_ = is->src_ + 1;
    pBVar10 = (handler->ctx).current_state;
    iVar6 = (*pBVar10->_vptr_BaseState[8])(pBVar10,handler);
    if ((BaseState<true> *)CONCAT44(extraout_var,iVar6) != (BaseState<true> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var,iVar6);
      pbVar7 = (byte *)is->src_;
      while (((ulong)*pbVar7 < 0x21 && ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
        pbVar7 = pbVar7 + 1;
      }
      is->src_ = (Ch *)pbVar7;
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*pbVar7 == 0x5d) {
        is->src_ = (Ch *)(pbVar7 + 1);
        pBVar10 = (handler->ctx).current_state;
        pp_Var8 = pBVar10->_vptr_BaseState;
        uVar13 = 0;
      }
      else {
        uVar15 = 0;
        while( true ) {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar7 = (byte *)is->src_;
          pbVar11 = pbVar7;
          while (((ulong)*pbVar7 < 0x21 && ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
            pbVar7 = pbVar7 + 1;
            pbVar11 = pbVar11 + 1;
          }
          is->src_ = (Ch *)pbVar7;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          uVar15 = uVar15 + 1;
          if (*pbVar7 != 0x2c) break;
          pbVar7 = pbVar7 + 1;
          is->src_ = (Ch *)pbVar7;
          while (((ulong)*pbVar7 < 0x21 && ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
            pbVar7 = pbVar7 + 1;
          }
          is->src_ = (Ch *)pbVar7;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pbVar7 != 0x5d) {
          pCVar12 = is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          *(long *)(this + 0x38) = (long)pbVar11 - (long)pCVar12;
          return;
        }
        is->src_ = (Ch *)(pbVar7 + 1);
        pBVar10 = (handler->ctx).current_state;
        pp_Var8 = pBVar10->_vptr_BaseState;
        uVar13 = (ulong)uVar15;
      }
      iVar6 = (*pp_Var8[9])(pBVar10,handler,uVar13);
      if ((BaseState<true> *)CONCAT44(extraout_var_00,iVar6) != (BaseState<true> *)0x0) {
        (handler->ctx).previous_state = (handler->ctx).current_state;
        (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var_00,iVar6);
        return;
      }
    }
    pCVar12 = is->src_;
    pCVar3 = is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
    *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar3;
    return;
  }
  if (bVar2 == 0x6e) {
    pCVar3 = is->src_;
    pCVar12 = pCVar3 + 1;
    is->src_ = pCVar12;
    if (pCVar3[1] == 'u') {
      pCVar12 = pCVar3 + 2;
      is->src_ = pCVar12;
      if (pCVar3[2] == 'l') {
        pCVar12 = pCVar3 + 3;
        is->src_ = pCVar12;
        if (pCVar3[3] == 'l') {
          is->src_ = pCVar3 + 4;
          pBVar10 = (handler->ctx).current_state;
          iVar6 = (**pBVar10->_vptr_BaseState)(pBVar10,handler);
          if ((BaseState<true> *)CONCAT44(extraout_var_06,iVar6) != (BaseState<true> *)0x0) {
            (handler->ctx).previous_state = (handler->ctx).current_state;
            (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var_06,iVar6);
            return;
          }
          pCVar12 = is->src_;
          pCVar3 = is->head_;
          *(undefined4 *)(this + 0x30) = 0x10;
          *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar3;
          return;
        }
      }
    }
    pCVar3 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar3;
    return;
  }
  if (bVar2 == 0x74) {
    pCVar3 = is->src_;
    pCVar12 = pCVar3 + 1;
    is->src_ = pCVar12;
    if (pCVar3[1] == 'r') {
      pCVar12 = pCVar3 + 2;
      is->src_ = pCVar12;
      if (pCVar3[2] == 'u') {
        pCVar12 = pCVar3 + 3;
        is->src_ = pCVar12;
        if (pCVar3[3] == 'e') {
          is->src_ = pCVar3 + 4;
          pBVar10 = (handler->ctx).current_state;
          iVar6 = (*pBVar10->_vptr_BaseState[1])(pBVar10,handler,1);
          if ((BaseState<true> *)CONCAT44(extraout_var_07,iVar6) != (BaseState<true> *)0x0) {
            (handler->ctx).previous_state = (handler->ctx).current_state;
            (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var_07,iVar6);
            return;
          }
          pCVar12 = is->src_;
          pCVar3 = is->head_;
          *(undefined4 *)(this + 0x30) = 0x10;
          *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar3;
          return;
        }
      }
    }
    pCVar3 = is->head_;
    *(undefined4 *)(this + 0x30) = 3;
    *(long *)(this + 0x38) = (long)pCVar12 - (long)pCVar3;
    return;
  }
  if (bVar2 == 0x7b) {
    ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
              (this,is,handler);
    return;
  }
  pbVar11 = (byte *)is->src_;
  pCVar12 = is->head_;
  bVar2 = *pbVar11;
  pbVar7 = pbVar11;
  bVar20 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar7 = pbVar11 + 1;
    bVar20 = pbVar11[1];
  }
  pCVar3 = is->dst_;
  if (bVar20 == 0x30) {
    uVar15 = (uint)pbVar7[1];
    pbVar7 = pbVar7 + 1;
    dVar22 = 0.0;
    bVar21 = false;
    bVar4 = false;
    iVar6 = 0;
    uVar16 = 0;
    bVar5 = false;
    uVar14 = 0;
  }
  else {
    if (8 < (byte)(bVar20 - 0x31)) {
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pbVar7 - (long)pCVar12;
      goto LAB_0011617b;
    }
    uVar14 = (ulong)(bVar20 - 0x30);
    bVar20 = pbVar7[1];
    uVar13 = (ulong)bVar20;
    pbVar7 = pbVar7 + 1;
    dVar22 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar20 - 0x30) < 10) {
        iVar6 = 0;
LAB_00115be4:
        uVar15 = (uint)uVar14;
        if (uVar15 < 0xccccccc) {
LAB_00115bec:
          uVar14 = (ulong)((uVar15 * 10 + (int)uVar13) - 0x30);
          iVar6 = iVar6 + 1;
          bVar20 = pbVar7[1];
          uVar13 = (ulong)bVar20;
          pbVar7 = pbVar7 + 1;
          if (9 < (byte)(bVar20 - 0x30)) goto LAB_00115cc0;
          goto LAB_00115be4;
        }
        if (uVar15 != 0xccccccc) goto LAB_00115c64;
        if ((byte)uVar13 < 0x39) goto LAB_00115bec;
        uVar14 = 0xccccccc;
        uVar13 = 0x39;
LAB_00115c64:
        uVar16 = uVar14;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar16) && (0x38 < (byte)uVar13 || uVar16 != 0xccccccccccccccc)
               ) goto LAB_00115d18;
            uVar16 = (uVar13 & 0xf) + uVar16 * 10;
            iVar6 = iVar6 + 1;
            bVar20 = pbVar7[1];
            uVar13 = (ulong)bVar20;
            pbVar7 = pbVar7 + 1;
          } while ((byte)(bVar20 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar16) &&
               (0x35 < (byte)uVar13 || uVar16 != 0x1999999999999999)) goto LAB_00115d18;
            uVar16 = (uVar13 & 0xf) + uVar16 * 10;
            iVar6 = iVar6 + 1;
            bVar20 = pbVar7[1];
            uVar13 = (ulong)bVar20;
            pbVar7 = pbVar7 + 1;
          } while ((byte)(bVar20 - 0x30) < 10);
        }
        uVar15 = (uint)bVar20;
        dVar22 = 0.0;
        bVar5 = true;
        bVar21 = false;
        bVar4 = false;
        goto LAB_00115d91;
      }
LAB_00115fd4:
      iVar6 = 0;
    }
    else {
      if (9 < (byte)(bVar20 - 0x30)) goto LAB_00115fd4;
      iVar6 = 0;
      do {
        uVar15 = (uint)uVar14;
        if (0x19999998 < uVar15) {
          if (uVar15 != 0x19999999) goto LAB_00115c64;
          if (0x35 < (byte)uVar13) {
            uVar14 = 0x19999999;
            goto LAB_00115c64;
          }
        }
        uVar14 = (ulong)((uVar15 * 10 + (int)uVar13) - 0x30);
        iVar6 = iVar6 + 1;
        bVar20 = pbVar7[1];
        uVar13 = (ulong)bVar20;
        pbVar7 = pbVar7 + 1;
      } while ((byte)(bVar20 - 0x30) < 10);
    }
LAB_00115cc0:
    uVar15 = (uint)bVar20;
    bVar4 = false;
    bVar21 = false;
    uVar16 = 0;
    bVar5 = false;
  }
  goto LAB_00115d91;
LAB_00115f3e:
  do {
    pbVar19 = pbVar7 + 1;
    pbVar7 = pbVar7 + 1;
  } while ((byte)(*pbVar19 - 0x30) < 10);
  goto LAB_00116044;
LAB_00115d18:
  auVar25._8_4_ = (int)(uVar16 >> 0x20);
  auVar25._0_8_ = uVar16;
  auVar25._12_4_ = 0x45300000;
  dVar22 = (auVar25._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
  do {
    if (1.7976931348623158e+307 <= dVar22) goto LAB_0011602c;
    dVar22 = dVar22 * 10.0 + (double)((int)uVar13 + -0x30);
    bVar20 = pbVar7[1];
    uVar13 = (ulong)bVar20;
    uVar15 = (uint)bVar20;
    pbVar7 = pbVar7 + 1;
  } while ((byte)(bVar20 - 0x30) < 10);
  bVar21 = true;
  bVar4 = true;
  bVar5 = true;
LAB_00115d91:
  if ((char)uVar15 == '.') {
    pbVar19 = pbVar7 + 1;
    uVar15 = (uint)*pbVar19;
    pbVar7 = pbVar7 + 1;
    if ((byte)(*pbVar19 - 0x3a) < 0xf6) {
      lVar9 = (long)pbVar7 - (long)pCVar12;
      *(undefined4 *)(this + 0x30) = 0xe;
LAB_00115fc3:
      *(long *)(this + 0x38) = lVar9;
      goto LAB_0011617b;
    }
    iVar18 = 0;
    if (bVar21) {
LAB_00115e43:
      do {
        if (0x39 < (byte)uVar15) goto LAB_00115e84;
        if (iVar6 < 0x11) {
          dVar22 = dVar22 * 10.0 + (double)(int)(uVar15 - 0x30);
          iVar18 = iVar18 + -1;
          if (0.0 < dVar22) {
            iVar6 = iVar6 + 1;
          }
        }
        pbVar19 = pbVar7 + 1;
        uVar15 = (uint)*pbVar19;
        pbVar7 = pbVar7 + 1;
      } while ('/' < (char)*pbVar19);
      pbVar19 = pbVar7;
      iVar6 = 0;
      goto LAB_00116054;
    }
    if (!bVar5) {
      uVar16 = uVar14;
    }
    iVar18 = 0;
    do {
      if ((0x39 < (byte)uVar15) || (uVar16 >> 0x35 != 0)) {
        auVar26._8_4_ = (int)(uVar16 >> 0x20);
        auVar26._0_8_ = uVar16;
        auVar26._12_4_ = 0x45300000;
        dVar22 = (auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0);
        bVar4 = true;
        goto LAB_00115e43;
      }
      pbVar19 = pbVar7 + 1;
      iVar18 = iVar18 + -1;
      uVar16 = (ulong)(uVar15 - 0x30) + uVar16 * 10;
      iVar6 = iVar6 + (uint)(uVar16 != 0);
      pbVar1 = pbVar7 + 1;
      uVar15 = (uint)*pbVar1;
      pbVar7 = pbVar19;
    } while ('/' < (char)*pbVar1);
    dVar22 = (double)(long)uVar16;
    iVar6 = 0;
LAB_00116059:
    uVar15 = iVar6 + iVar18;
    if ((int)uVar15 < -0x134) {
      dVar24 = 0.0;
      if (0xfffffd97 < uVar15) {
        dVar22 = (dVar22 / 1e+308) /
                 *(double *)(internal::Pow10(int)::e + (ulong)(-uVar15 - 0x134) * 8);
        dVar24 = dVar22;
      }
    }
    else if ((int)uVar15 < 0) {
      dVar22 = dVar22 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar15 * 8);
      dVar24 = dVar22;
    }
    else {
      dVar22 = dVar22 * *(double *)(internal::Pow10(int)::e + (ulong)uVar15 * 8);
      dVar24 = dVar22;
    }
    if (bVar2 == 0x2d) {
      dVar24 = -dVar24;
    }
    pBVar10 = (handler->ctx).current_state;
    iVar6 = (*pBVar10->_vptr_BaseState[2])
                      (CONCAT44((int)((ulong)dVar22 >> 0x20),(float)dVar24),pBVar10,handler);
    pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_04,iVar6);
    pbVar7 = pbVar19;
  }
  else {
    iVar18 = 0;
LAB_00115e84:
    pbVar19 = pbVar7;
    iVar6 = 0;
    if ((uVar15 | 0x20) == 0x65) {
      uVar13 = uVar14;
      if (bVar5) {
        uVar13 = uVar16;
      }
      if (!bVar4) {
        auVar27._8_4_ = (int)(uVar13 >> 0x20);
        auVar27._0_8_ = uVar13;
        auVar27._12_4_ = 0x45300000;
        dVar22 = (auVar27._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
        bVar4 = true;
      }
      bVar20 = pbVar7[1];
      bVar21 = bVar20 != 0x2b;
      if ((bVar21) && (bVar20 != 0x2d)) {
        if ((byte)(bVar20 - 0x30) < 10) {
          pbVar7 = pbVar7 + 2;
          iVar17 = bVar20 - 0x30;
LAB_00116004:
          do {
            bVar20 = *pbVar7;
            if (9 < (byte)(bVar20 - 0x30)) {
              bVar21 = false;
              goto LAB_00116044;
            }
            pbVar7 = pbVar7 + 1;
            iVar17 = iVar17 * 10 + (uint)bVar20 + -0x30;
          } while (iVar17 <= 0x134 - iVar18);
LAB_0011602c:
          *(undefined4 *)(this + 0x30) = 0xd;
          *(long *)(this + 0x38) = (long)pbVar11 - (long)pCVar12;
          goto LAB_0011617b;
        }
        pbVar7 = pbVar7 + 1;
      }
      else {
        pbVar19 = pbVar7 + 2;
        if ((byte)(*pbVar19 - 0x30) < 10) {
          pbVar7 = pbVar7 + 3;
          iVar17 = *pbVar19 - 0x30;
          if (bVar20 == 0x2b) goto LAB_00116004;
          bVar20 = *pbVar7;
          if ((byte)(bVar20 - 0x30) < 10) {
            do {
              iVar17 = iVar17 * 10 + (uint)bVar20 + -0x30;
              if (0xccccccb < iVar17) goto LAB_00115f3e;
              pbVar7 = pbVar7 + 1;
              bVar20 = *pbVar7;
            } while ((byte)(bVar20 - 0x30) < 10);
          }
          else {
            bVar21 = true;
          }
LAB_00116044:
          pbVar19 = pbVar7;
          iVar6 = -iVar17;
          if (!bVar21) {
            iVar6 = iVar17;
          }
          goto LAB_00116054;
        }
        pbVar7 = pbVar7 + 2;
      }
      lVar9 = (long)pbVar7 - (long)pCVar12;
      *(undefined4 *)(this + 0x30) = 0xf;
      goto LAB_00115fc3;
    }
LAB_00116054:
    if (bVar4) goto LAB_00116059;
    uVar23 = (undefined4)((ulong)dVar22 >> 0x20);
    pbVar7 = pbVar19;
    if (bVar5) {
      if (bVar2 == 0x2d) {
        pBVar10 = (handler->ctx).current_state;
        iVar6 = (*pBVar10->_vptr_BaseState[2])
                          (CONCAT44(uVar23,(float)(long)-uVar16),pBVar10,handler);
        pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_01,iVar6);
      }
      else {
        pBVar10 = (handler->ctx).current_state;
        iVar6 = (*pBVar10->_vptr_BaseState[2])(CONCAT44(uVar23,(float)uVar16),pBVar10,handler);
        pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_05,iVar6);
      }
    }
    else if (bVar2 == 0x2d) {
      pBVar10 = (handler->ctx).current_state;
      iVar6 = (*pBVar10->_vptr_BaseState[2])(CONCAT44(uVar23,(float)-(int)uVar14),pBVar10,handler);
      pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_02,iVar6);
    }
    else {
      pBVar10 = (handler->ctx).current_state;
      iVar6 = (*pBVar10->_vptr_BaseState[3])(pBVar10,handler);
      pBVar10 = (BaseState<true> *)CONCAT44(extraout_var_03,iVar6);
    }
  }
  if (pBVar10 == (BaseState<true> *)0x0) {
    *(undefined4 *)(this + 0x30) = 0x10;
    *(long *)(this + 0x38) = (long)pbVar11 - (long)pCVar12;
  }
  else {
    (handler->ctx).previous_state = (handler->ctx).current_state;
    (handler->ctx).current_state = pBVar10;
  }
LAB_0011617b:
  is->src_ = (Ch *)pbVar7;
  is->dst_ = pCVar3;
  is->head_ = pCVar12;
  return;
}

Assistant:

Ch Peek() { return *src_; }